

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void print2Columns(char *fmt,uint l1,uint l2,char *c1,char *c2)

{
  char *sbuf;
  char *sbuf_00;
  bool local_79;
  char *local_78;
  char *local_60;
  char *c2buf;
  char *c1buf;
  char *pc2;
  char *pc1;
  char *c2_local;
  char *c1_local;
  uint l2_local;
  uint l1_local;
  char *fmt_local;
  
  sbuf = (char *)malloc((ulong)(l1 + 1));
  sbuf_00 = (char *)malloc((ulong)(l2 + 1));
  if (sbuf == (char *)0x0) {
    outOfMemory();
  }
  c1buf = c2;
  pc2 = c1;
  if (sbuf_00 == (char *)0x0) {
    outOfMemory();
  }
  do {
    pc2 = cutToWhiteSpace(pc2,l1,sbuf);
    c1buf = cutToWhiteSpace(c1buf,l2,sbuf_00);
    local_60 = sbuf;
    if (*sbuf == '\0') {
      local_60 = "";
    }
    local_78 = sbuf_00;
    if (*sbuf_00 == '\0') {
      local_78 = "";
    }
    printf(fmt,(ulong)l1,(ulong)l1,local_60,(ulong)l2,(ulong)l2,local_78);
    local_79 = pc2 != (char *)0x0 || c1buf != (char *)0x0;
  } while (local_79);
  free(sbuf);
  free(sbuf_00);
  return;
}

Assistant:

static void print2Columns(const char* fmt, /**< The format string for formatting the output. */
                          uint l1,         /**< The width of column 1. */
                          uint l2,         /**< The width of column 2. */
                          const char *c1,  /**< The contents of column 1. */
                          const char *c2   /**< The contents of column 2. */
)
{
    const char *pc1=c1, *pc2=c2;
    char *c1buf = (char *)malloc(l1+1);
    char *c2buf = (char *)malloc(l2+1);
    if (!c1buf) outOfMemory();
    if (!c2buf) outOfMemory();

    do
    {
        pc1 = cutToWhiteSpace(pc1, l1, c1buf);
        pc2 = cutToWhiteSpace(pc2, l2, c2buf);
        printf(fmt, l1, l1, c1buf[0]!='\0'?c1buf:"",
                    l2, l2, c2buf[0]!='\0'?c2buf:"");
    } while (pc1 || pc2);
    free(c1buf);
    free(c2buf);
}